

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
SolverAppTest_AddNLExtension_Test::~SolverAppTest_AddNLExtension_Test
          (SolverAppTest_AddNLExtension_Test *this)

{
  void *in_RDI;
  
  ~SolverAppTest_AddNLExtension_Test((SolverAppTest_AddNLExtension_Test *)0x1654f8);
  operator_delete(in_RDI,0x5f8);
  return;
}

Assistant:

TEST_F(SolverAppTest, AddNLExtension) {
  AddOption();
  testing::InSequence sequence;
  EXPECT_CALL(handler_, OnOption()).WillOnce(Return(true));
  EXPECT_CALL(app_.reader(), DoRead(StringRefEq("testproblem.nl"), _, 0));
  EXPECT_EQ(0, app_.Run(Args("test", "-w", "testproblem")));
}